

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  RealScalar RVar2;
  undefined1 auVar3 [16];
  size_t numberPoints;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position;
  MatrixXd gt;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  rotation_t local_2f0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  rotation_t rotation;
  undefined1 local_248 [120];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1d0 [24];
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  rotation_t eigensolver_rotation;
  translation_t t_perturbed;
  CentralRelativeAdapter adapter;
  rotation_t rotation2;
  rotation_t R_perturbed;
  
  opengv::initializeRandomSeed();
  numberPoints = 10;
  local_248._8_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&position1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_248);
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomDirectionTranslation(&position2,0.0005);
  opengv::generateRandomRotation(&rotation2,0.5);
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&camOffsets,&camRotations);
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&gt,(int *)local_248,&numberPoints);
  opengv::generateRandom2D2DCorrespondences
            (&position1,&rotation1,&position2,&rotation2,&camOffsets,&camRotations,numberPoints,0.5,
             0.0,&bearingVectors1,&bearingVectors2,&camCorrespondences1,&camCorrespondences2,&gt);
  opengv::extractRelativePose(&position1,&position2,&rotation1,&rotation2,&position,&rotation,true);
  opengv::printExperimentCharacteristics(&position,&rotation,0.5,0.0);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&adapter,&bearingVectors1,&bearingVectors2,&rotation);
  poVar1 = std::operator<<((ostream *)&std::cout,"running eigensolver with perturbed rotation");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&position,&rotation,&t_perturbed,&R_perturbed,0.01);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (&adapter.super_RelativeAdapterBase._R12,&R_perturbed);
  local_248._88_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
  local_248._24_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
  local_248._32_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  local_248._40_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
  local_248._48_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
  local_248._56_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
  local_248._64_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
  local_248._72_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
  local_248._80_8_ =
       adapter.super_RelativeAdapterBase._R12.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
  opengv::relative_pose::eigensolver
            (&local_2f0,&adapter.super_RelativeAdapterBase,(eigensolverOutput_t *)local_248,false);
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[8] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[0] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[1] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[2] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[3] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[4] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[5] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[6] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  eigensolver_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
  .array[7] = local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7];
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eigensystem based rotation solver:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             &eigensolver_rotation);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the eigenvectors are: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_1d0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the eigenvalues are: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(local_248 + 0x60))
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the norms of the eigenvectors are: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &local_2f0);
  poVar1 = std::ostream::_M_insert<double>(RVar2);
  std::operator<<(poVar1," ");
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       4.94065645841247e-324;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1b8;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &local_2f0);
  poVar1 = std::ostream::_M_insert<double>(RVar2);
  std::operator<<(poVar1," ");
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       9.88131291682493e-324;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1a0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &local_2f0);
  poVar1 = std::ostream::_M_insert<double>(RVar2);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the orthogongality is: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2a8 = 0;
  local_2a0 = 1;
  local_298 = 3;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)local_1b8;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)local_1d0;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_2f0);
  std::operator<<((ostream *)&std::cout," ");
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2a8 = 0;
  local_2a0 = 2;
  local_298 = 3;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)local_1a0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)local_1d0;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_2f0);
  std::operator<<((ostream *)&std::cout," ");
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       4.94065645841247e-324;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       1.48219693752374e-323;
  local_2a8 = 0;
  local_2a0 = 2;
  local_298 = 3;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1b8;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_1d0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)local_1a0;
  local_2f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)local_1d0;
  Eigen::operator<<((ostream *)&std::cout,
                    (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
                     *)&local_2f0);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the norm of the translation is: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (double)local_248._16_8_ * (double)local_248._16_8_ +
                 (double)CONCAT44(local_248._4_4_,local_248._0_4_) *
                 (double)CONCAT44(local_248._4_4_,local_248._0_4_) +
                 (double)local_248._8_8_ * (double)local_248._8_8_;
  auVar3 = vsqrtsd_avx(auVar3,auVar3);
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&adapter);
  Eigen::internal::handmade_aligned_free
            (gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&bearingVectors2.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&bearingVectors1.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&camRotations.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&camOffsets.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.0005);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //run experiments
  std::cout << "running eigensolver with perturbed rotation" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.setR12(R_perturbed);
  rotation_t eigensolver_rotation;
  eigensolverOutput_t output;
  output.rotation = adapter.getR12(); //transferring the initial value
  eigensolver_rotation = relative_pose::eigensolver(adapter,output);

  //print results
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl;
  std::cout << "the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors << std::endl << std::endl;
  std::cout << "the eigenvalues are: " << std::endl;
  std::cout << output.eigenvalues << std::endl << std::endl;
  std::cout << "the norms of the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors.col(0).norm() << " ";
  std::cout << output.eigenvectors.col(1).norm() << " ";
  std::cout << output.eigenvectors.col(2).norm() << std::endl << std::endl;
  std::cout << "the orthogongality is: " << std::endl;
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(1);
  std::cout << " ";
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(2);
  std::cout << " ";
  std::cout << output.eigenvectors.col(1).transpose()*output.eigenvectors.col(2);
  std::cout << std::endl << std::endl;
  std::cout << "the norm of the translation is: " << std::endl;
  std::cout << output.translation.norm() << std::endl;

}